

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

void * ecs_os_memdup(void *src,ecs_size_t size)

{
  void *dst;
  ecs_size_t size_local;
  void *src_local;
  
  if (src == (void *)0x0) {
    src_local = (void *)0x0;
  }
  else {
    src_local = (*ecs_os_api.malloc_)(size);
    _ecs_assert(src_local != (void *)0x0,0x11,(char *)0x0,"dst != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/misc.c"
                ,0x6c);
    if (src_local == (void *)0x0) {
      __assert_fail("dst != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/misc.c"
                    ,0x6c,"void *ecs_os_memdup(const void *, ecs_size_t)");
    }
    memcpy(src_local,src,(long)size);
  }
  return src_local;
}

Assistant:

void* ecs_os_memdup(
    const void *src, 
    ecs_size_t size) 
{
    if (!src) {
        return NULL;
    }
    
    void *dst = ecs_os_malloc(size);
    ecs_assert(dst != NULL, ECS_OUT_OF_MEMORY, NULL);
    ecs_os_memcpy(dst, src, size);  
    return dst;  
}